

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O3

QModelIndex * __thiscall
QTransposeProxyModel::parent
          (QModelIndex *__return_storage_ptr__,QTransposeProxyModel *this,QModelIndex *index)

{
  QTransposeProxyModelPrivate *this_00;
  parameter_type pQVar1;
  long in_FS_OFFSET;
  QModelIndex QStack_58;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTransposeProxyModelPrivate **)(this + 8);
  pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           ::value(&(this_00->super_QAbstractProxyModelPrivate).model);
  if ((((pQVar1 == (parameter_type)0x0) || (index->r < 0)) || (index->c < 0)) ||
     ((index->m).ptr == (QAbstractItemModel *)0x0)) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0048edcb;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
  else {
    QTransposeProxyModelPrivate::uncheckedMapToSource(&QStack_58,this_00,index);
    if (QStack_58.m.ptr == (QAbstractItemModel *)0x0) {
      local_40.r = -1;
      local_40.c = -1;
      local_40.i = 0;
      local_40.m.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      (*((QStack_58.m.ptr)->super_QObject)._vptr_QObject[0xd])(&local_40,QStack_58.m.ptr,&QStack_58)
      ;
    }
    QTransposeProxyModelPrivate::uncheckedMapFromSource(__return_storage_ptr__,this_00,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_0048edcb:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QTransposeProxyModel::parent(const QModelIndex &index) const
{
    Q_D(const QTransposeProxyModel);
    Q_ASSERT(checkIndex(index, CheckIndexOption::DoNotUseParent));
    if (!d->model || !index.isValid())
        return QModelIndex();
    return d->uncheckedMapFromSource(d->uncheckedMapToSource(index).parent());
}